

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dumpmode.c
# Opt level: O0

int DumpModeDecode(TIFF *tif,uint8_t *buf,tmsize_t cc,uint16_t s)

{
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *buf_local;
  TIFF *tif_local;
  
  if (tif->tif_rawcc < cc) {
    TIFFErrorExtR(tif,"DumpModeDecode",
                  "Not enough data for scanline %u, expected a request for at most %ld bytes, got a request for %ld bytes"
                  ,(ulong)tif->tif_row,tif->tif_rawcc,cc);
    tif_local._4_4_ = 0;
  }
  else {
    if (tif->tif_rawcp != buf) {
      _TIFFmemcpy(buf,tif->tif_rawcp,cc);
    }
    tif->tif_rawcp = tif->tif_rawcp + cc;
    tif->tif_rawcc = tif->tif_rawcc - cc;
    tif_local._4_4_ = 1;
  }
  return tif_local._4_4_;
}

Assistant:

static int DumpModeDecode(TIFF *tif, uint8_t *buf, tmsize_t cc, uint16_t s)
{
    static const char module[] = "DumpModeDecode";
    (void)s;
    if (tif->tif_rawcc < cc)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data for scanline %" PRIu32
                      ", expected a request for at most %" TIFF_SSIZE_FORMAT
                      " bytes, got a request for %" TIFF_SSIZE_FORMAT " bytes",
                      tif->tif_row, tif->tif_rawcc, cc);
        return (0);
    }
    /*
     * Avoid copy if client has setup raw
     * data buffer to avoid extra copy.
     */
    if (tif->tif_rawcp != buf)
        _TIFFmemcpy(buf, tif->tif_rawcp, cc);
    tif->tif_rawcp += cc;
    tif->tif_rawcc -= cc;
    return (1);
}